

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

z_size_t gzfread(voidp buf,z_size_t size,z_size_t nitems,gzFile file)

{
  ulong len_00;
  z_size_t zVar1;
  voidp local_48;
  gz_statep state;
  z_size_t len;
  gzFile file_local;
  z_size_t nitems_local;
  z_size_t size_local;
  voidp buf_local;
  
  if (file == (gzFile)0x0) {
    buf_local = (voidp)0x0;
  }
  else if ((file[1].have == 0x1c4f) &&
          ((*(int *)((long)&file[4].next + 4) == 0 || (*(int *)((long)&file[4].next + 4) == -5)))) {
    len_00 = nitems * size;
    if ((size == 0) || (len_00 / size == nitems)) {
      if (len_00 == 0) {
        local_48 = (voidp)0x0;
      }
      else {
        zVar1 = gz_read((gz_statep)file,buf,len_00);
        local_48 = (voidp)(zVar1 / size);
      }
      buf_local = local_48;
    }
    else {
      gz_error((gz_statep)file,-2,"request does not fit in a size_t");
      buf_local = (voidp)0x0;
    }
  }
  else {
    buf_local = (voidp)0x0;
  }
  return (z_size_t)buf_local;
}

Assistant:

z_size_t ZEXPORT gzfread(buf, size, nitems, file)
    voidp buf;
    z_size_t size;
    z_size_t nitems;
    gzFile file;
{
    z_size_t len;
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_statep)file;

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ ||
            (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return 0;

    /* compute bytes to read -- error on overflow */
    len = nitems * size;
    if (size && len / size != nitems) {
        gz_error(state, Z_STREAM_ERROR, "request does not fit in a size_t");
        return 0;
    }

    /* read len or fewer bytes to buf, return the number of full items read */
    return len ? gz_read(state, buf, len) / size : 0;
}